

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O2

upb_CType upb_MiniTableField_CType(upb_MiniTableField *f)

{
  byte bVar1;
  ulong uStack_8;
  
  bVar1 = f->descriptortype_dont_copy_me__upb_internal_use_only;
  if ((f->mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
    uStack_8 = (ulong)(bVar1 - 1);
  }
  else if (bVar1 == 5) {
    uStack_8 = 0xd;
  }
  else {
    if (bVar1 != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                    ,0x7b,"upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)"
                   );
    }
    uStack_8 = 8;
  }
  return *(upb_CType *)(upb_FieldType_CType_c_type + uStack_8 * 4);
}

Assistant:

UPB_API_INLINE upb_FieldType
upb_MiniTableField_Type(const struct upb_MiniTableField* f) {
  const upb_FieldType type = (upb_FieldType)f->UPB_PRIVATE(descriptortype);
  if (UPB_PRIVATE(_upb_MiniTableField_IsAlternate)(f)) {
    if (type == kUpb_FieldType_Int32) return kUpb_FieldType_Enum;
    if (type == kUpb_FieldType_Bytes) return kUpb_FieldType_String;
    UPB_ASSERT(false);
  }
  return type;
}